

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

char * eat_name(char *p)

{
  int iVar1;
  char *local_10;
  char *p_local;
  
  local_10 = p;
  while( true ) {
    while( true ) {
      iVar1 = is_esc(*local_10);
      if (iVar1 == 0) break;
      local_10 = scan_esc(local_10);
    }
    iVar1 = is_name_char(*local_10);
    if (iVar1 == 0) break;
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static char *eat_name(char *p) {
  for (;;) {
    if (is_esc(*p)) {
      p = scan_esc(p);
      continue;
    }
    if (!is_name_char(*p)) {
      return p;
    }
    p++;
  }
}